

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LTWeather.cpp
# Opt level: O2

float WeatherQNHfromMETAR(string *metar)

{
  pointer pGVar1;
  optional<float> oVar2;
  Pressure local_10;
  
  ParseMETAR(metar);
  pGVar1 = ParseMETAR::metarResult.groups.
           super__Vector_base<metaf::GroupInfo,_std::allocator<metaf::GroupInfo>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (ParseMETAR::metarResult.reportMetadata.error == NONE) {
    for (; pGVar1 != ParseMETAR::metarResult.groups.
                     super__Vector_base<metaf::GroupInfo,_std::allocator<metaf::GroupInfo>_>._M_impl
                     .super__Vector_impl_data._M_finish; pGVar1 = pGVar1 + 1) {
      if ((pGVar1 != (pointer)0x0) &&
         (*(__index_type *)
           ((long)&(pGVar1->group).
                   super__Variant_base<metaf::KeywordGroup,_metaf::LocationGroup,_metaf::ReportTimeGroup,_metaf::TrendGroup,_metaf::WindGroup,_metaf::VisibilityGroup,_metaf::CloudGroup,_metaf::WeatherGroup,_metaf::TemperatureGroup,_metaf::PressureGroup,_metaf::RunwayStateGroup,_metaf::SeaSurfaceGroup,_metaf::MinMaxTemperatureGroup,_metaf::PrecipitationGroup,_metaf::LayerForecastGroup,_metaf::PressureTendencyGroup,_metaf::CloudTypesGroup,_metaf::LowMidHighCloudGroup,_metaf::LightningGroup,_metaf::VicinityGroup,_metaf::MiscGroup,_metaf::UnknownGroup>
                   .
                   super__Move_assign_alias<metaf::KeywordGroup,_metaf::LocationGroup,_metaf::ReportTimeGroup,_metaf::TrendGroup,_metaf::WindGroup,_metaf::VisibilityGroup,_metaf::CloudGroup,_metaf::WeatherGroup,_metaf::TemperatureGroup,_metaf::PressureGroup,_metaf::RunwayStateGroup,_metaf::SeaSurfaceGroup,_metaf::MinMaxTemperatureGroup,_metaf::PrecipitationGroup,_metaf::LayerForecastGroup,_metaf::PressureTendencyGroup,_metaf::CloudTypesGroup,_metaf::LowMidHighCloudGroup,_metaf::LightningGroup,_metaf::VicinityGroup,_metaf::MiscGroup,_metaf::UnknownGroup>
                   .
                   super__Copy_assign_alias<metaf::KeywordGroup,_metaf::LocationGroup,_metaf::ReportTimeGroup,_metaf::TrendGroup,_metaf::WindGroup,_metaf::VisibilityGroup,_metaf::CloudGroup,_metaf::WeatherGroup,_metaf::TemperatureGroup,_metaf::PressureGroup,_metaf::RunwayStateGroup,_metaf::SeaSurfaceGroup,_metaf::MinMaxTemperatureGroup,_metaf::PrecipitationGroup,_metaf::LayerForecastGroup,_metaf::PressureTendencyGroup,_metaf::CloudTypesGroup,_metaf::LowMidHighCloudGroup,_metaf::LightningGroup,_metaf::VicinityGroup,_metaf::MiscGroup,_metaf::UnknownGroup>
                   .
                   super__Move_ctor_alias<metaf::KeywordGroup,_metaf::LocationGroup,_metaf::ReportTimeGroup,_metaf::TrendGroup,_metaf::WindGroup,_metaf::VisibilityGroup,_metaf::CloudGroup,_metaf::WeatherGroup,_metaf::TemperatureGroup,_metaf::PressureGroup,_metaf::RunwayStateGroup,_metaf::SeaSurfaceGroup,_metaf::MinMaxTemperatureGroup,_metaf::PrecipitationGroup,_metaf::LayerForecastGroup,_metaf::PressureTendencyGroup,_metaf::CloudTypesGroup,_metaf::LowMidHighCloudGroup,_metaf::LightningGroup,_metaf::VicinityGroup,_metaf::MiscGroup,_metaf::UnknownGroup>
                   .
                   super__Copy_ctor_alias<metaf::KeywordGroup,_metaf::LocationGroup,_metaf::ReportTimeGroup,_metaf::TrendGroup,_metaf::WindGroup,_metaf::VisibilityGroup,_metaf::CloudGroup,_metaf::WeatherGroup,_metaf::TemperatureGroup,_metaf::PressureGroup,_metaf::RunwayStateGroup,_metaf::SeaSurfaceGroup,_metaf::MinMaxTemperatureGroup,_metaf::PrecipitationGroup,_metaf::LayerForecastGroup,_metaf::PressureTendencyGroup,_metaf::CloudTypesGroup,_metaf::LowMidHighCloudGroup,_metaf::LightningGroup,_metaf::VicinityGroup,_metaf::MiscGroup,_metaf::UnknownGroup>
                   .
                   super__Variant_storage_alias<metaf::KeywordGroup,_metaf::LocationGroup,_metaf::ReportTimeGroup,_metaf::TrendGroup,_metaf::WindGroup,_metaf::VisibilityGroup,_metaf::CloudGroup,_metaf::WeatherGroup,_metaf::TemperatureGroup,_metaf::PressureGroup,_metaf::RunwayStateGroup,_metaf::SeaSurfaceGroup,_metaf::MinMaxTemperatureGroup,_metaf::PrecipitationGroup,_metaf::LayerForecastGroup,_metaf::PressureTendencyGroup,_metaf::CloudTypesGroup,_metaf::LowMidHighCloudGroup,_metaf::LightningGroup,_metaf::VicinityGroup,_metaf::MiscGroup,_metaf::UnknownGroup>
           + 0x1f8) == '\t')) {
        local_10.pressureValue.super__Optional_base<float,_true,_true>._M_payload.
        super__Optional_payload_base<float> =
             *(_Optional_base<float,_true,_true> *)
              &((_Optional_payload<float,_true,_true,_true> *)
               ((long)&(pGVar1->group).
                       super__Variant_base<metaf::KeywordGroup,_metaf::LocationGroup,_metaf::ReportTimeGroup,_metaf::TrendGroup,_metaf::WindGroup,_metaf::VisibilityGroup,_metaf::CloudGroup,_metaf::WeatherGroup,_metaf::TemperatureGroup,_metaf::PressureGroup,_metaf::RunwayStateGroup,_metaf::SeaSurfaceGroup,_metaf::MinMaxTemperatureGroup,_metaf::PrecipitationGroup,_metaf::LayerForecastGroup,_metaf::PressureTendencyGroup,_metaf::CloudTypesGroup,_metaf::LowMidHighCloudGroup,_metaf::LightningGroup,_metaf::VicinityGroup,_metaf::MiscGroup,_metaf::UnknownGroup>
                       .
                       super__Move_assign_alias<metaf::KeywordGroup,_metaf::LocationGroup,_metaf::ReportTimeGroup,_metaf::TrendGroup,_metaf::WindGroup,_metaf::VisibilityGroup,_metaf::CloudGroup,_metaf::WeatherGroup,_metaf::TemperatureGroup,_metaf::PressureGroup,_metaf::RunwayStateGroup,_metaf::SeaSurfaceGroup,_metaf::MinMaxTemperatureGroup,_metaf::PrecipitationGroup,_metaf::LayerForecastGroup,_metaf::PressureTendencyGroup,_metaf::CloudTypesGroup,_metaf::LowMidHighCloudGroup,_metaf::LightningGroup,_metaf::VicinityGroup,_metaf::MiscGroup,_metaf::UnknownGroup>
                       .
                       super__Copy_assign_alias<metaf::KeywordGroup,_metaf::LocationGroup,_metaf::ReportTimeGroup,_metaf::TrendGroup,_metaf::WindGroup,_metaf::VisibilityGroup,_metaf::CloudGroup,_metaf::WeatherGroup,_metaf::TemperatureGroup,_metaf::PressureGroup,_metaf::RunwayStateGroup,_metaf::SeaSurfaceGroup,_metaf::MinMaxTemperatureGroup,_metaf::PrecipitationGroup,_metaf::LayerForecastGroup,_metaf::PressureTendencyGroup,_metaf::CloudTypesGroup,_metaf::LowMidHighCloudGroup,_metaf::LightningGroup,_metaf::VicinityGroup,_metaf::MiscGroup,_metaf::UnknownGroup>
                       .
                       super__Move_ctor_alias<metaf::KeywordGroup,_metaf::LocationGroup,_metaf::ReportTimeGroup,_metaf::TrendGroup,_metaf::WindGroup,_metaf::VisibilityGroup,_metaf::CloudGroup,_metaf::WeatherGroup,_metaf::TemperatureGroup,_metaf::PressureGroup,_metaf::RunwayStateGroup,_metaf::SeaSurfaceGroup,_metaf::MinMaxTemperatureGroup,_metaf::PrecipitationGroup,_metaf::LayerForecastGroup,_metaf::PressureTendencyGroup,_metaf::CloudTypesGroup,_metaf::LowMidHighCloudGroup,_metaf::LightningGroup,_metaf::VicinityGroup,_metaf::MiscGroup,_metaf::UnknownGroup>
                       .
                       super__Copy_ctor_alias<metaf::KeywordGroup,_metaf::LocationGroup,_metaf::ReportTimeGroup,_metaf::TrendGroup,_metaf::WindGroup,_metaf::VisibilityGroup,_metaf::CloudGroup,_metaf::WeatherGroup,_metaf::TemperatureGroup,_metaf::PressureGroup,_metaf::RunwayStateGroup,_metaf::SeaSurfaceGroup,_metaf::MinMaxTemperatureGroup,_metaf::PrecipitationGroup,_metaf::LayerForecastGroup,_metaf::PressureTendencyGroup,_metaf::CloudTypesGroup,_metaf::LowMidHighCloudGroup,_metaf::LightningGroup,_metaf::VicinityGroup,_metaf::MiscGroup,_metaf::UnknownGroup>
                       .
                       super__Variant_storage_alias<metaf::KeywordGroup,_metaf::LocationGroup,_metaf::ReportTimeGroup,_metaf::TrendGroup,_metaf::WindGroup,_metaf::VisibilityGroup,_metaf::CloudGroup,_metaf::WeatherGroup,_metaf::TemperatureGroup,_metaf::PressureGroup,_metaf::RunwayStateGroup,_metaf::SeaSurfaceGroup,_metaf::MinMaxTemperatureGroup,_metaf::PrecipitationGroup,_metaf::LayerForecastGroup,_metaf::PressureTendencyGroup,_metaf::CloudTypesGroup,_metaf::LowMidHighCloudGroup,_metaf::LightningGroup,_metaf::VicinityGroup,_metaf::MiscGroup,_metaf::UnknownGroup>
               + 4))->super__Optional_payload_base<float>;
        local_10.pressureUnit =
             *(Unit *)((long)&(pGVar1->group).
                              super__Variant_base<metaf::KeywordGroup,_metaf::LocationGroup,_metaf::ReportTimeGroup,_metaf::TrendGroup,_metaf::WindGroup,_metaf::VisibilityGroup,_metaf::CloudGroup,_metaf::WeatherGroup,_metaf::TemperatureGroup,_metaf::PressureGroup,_metaf::RunwayStateGroup,_metaf::SeaSurfaceGroup,_metaf::MinMaxTemperatureGroup,_metaf::PrecipitationGroup,_metaf::LayerForecastGroup,_metaf::PressureTendencyGroup,_metaf::CloudTypesGroup,_metaf::LowMidHighCloudGroup,_metaf::LightningGroup,_metaf::VicinityGroup,_metaf::MiscGroup,_metaf::UnknownGroup>
                              .
                              super__Move_assign_alias<metaf::KeywordGroup,_metaf::LocationGroup,_metaf::ReportTimeGroup,_metaf::TrendGroup,_metaf::WindGroup,_metaf::VisibilityGroup,_metaf::CloudGroup,_metaf::WeatherGroup,_metaf::TemperatureGroup,_metaf::PressureGroup,_metaf::RunwayStateGroup,_metaf::SeaSurfaceGroup,_metaf::MinMaxTemperatureGroup,_metaf::PrecipitationGroup,_metaf::LayerForecastGroup,_metaf::PressureTendencyGroup,_metaf::CloudTypesGroup,_metaf::LowMidHighCloudGroup,_metaf::LightningGroup,_metaf::VicinityGroup,_metaf::MiscGroup,_metaf::UnknownGroup>
                              .
                              super__Copy_assign_alias<metaf::KeywordGroup,_metaf::LocationGroup,_metaf::ReportTimeGroup,_metaf::TrendGroup,_metaf::WindGroup,_metaf::VisibilityGroup,_metaf::CloudGroup,_metaf::WeatherGroup,_metaf::TemperatureGroup,_metaf::PressureGroup,_metaf::RunwayStateGroup,_metaf::SeaSurfaceGroup,_metaf::MinMaxTemperatureGroup,_metaf::PrecipitationGroup,_metaf::LayerForecastGroup,_metaf::PressureTendencyGroup,_metaf::CloudTypesGroup,_metaf::LowMidHighCloudGroup,_metaf::LightningGroup,_metaf::VicinityGroup,_metaf::MiscGroup,_metaf::UnknownGroup>
                              .
                              super__Move_ctor_alias<metaf::KeywordGroup,_metaf::LocationGroup,_metaf::ReportTimeGroup,_metaf::TrendGroup,_metaf::WindGroup,_metaf::VisibilityGroup,_metaf::CloudGroup,_metaf::WeatherGroup,_metaf::TemperatureGroup,_metaf::PressureGroup,_metaf::RunwayStateGroup,_metaf::SeaSurfaceGroup,_metaf::MinMaxTemperatureGroup,_metaf::PrecipitationGroup,_metaf::LayerForecastGroup,_metaf::PressureTendencyGroup,_metaf::CloudTypesGroup,_metaf::LowMidHighCloudGroup,_metaf::LightningGroup,_metaf::VicinityGroup,_metaf::MiscGroup,_metaf::UnknownGroup>
                              .
                              super__Copy_ctor_alias<metaf::KeywordGroup,_metaf::LocationGroup,_metaf::ReportTimeGroup,_metaf::TrendGroup,_metaf::WindGroup,_metaf::VisibilityGroup,_metaf::CloudGroup,_metaf::WeatherGroup,_metaf::TemperatureGroup,_metaf::PressureGroup,_metaf::RunwayStateGroup,_metaf::SeaSurfaceGroup,_metaf::MinMaxTemperatureGroup,_metaf::PrecipitationGroup,_metaf::LayerForecastGroup,_metaf::PressureTendencyGroup,_metaf::CloudTypesGroup,_metaf::LowMidHighCloudGroup,_metaf::LightningGroup,_metaf::VicinityGroup,_metaf::MiscGroup,_metaf::UnknownGroup>
                              .
                              super__Variant_storage_alias<metaf::KeywordGroup,_metaf::LocationGroup,_metaf::ReportTimeGroup,_metaf::TrendGroup,_metaf::WindGroup,_metaf::VisibilityGroup,_metaf::CloudGroup,_metaf::WeatherGroup,_metaf::TemperatureGroup,_metaf::PressureGroup,_metaf::RunwayStateGroup,_metaf::SeaSurfaceGroup,_metaf::MinMaxTemperatureGroup,_metaf::PrecipitationGroup,_metaf::LayerForecastGroup,_metaf::PressureTendencyGroup,_metaf::CloudTypesGroup,_metaf::LowMidHighCloudGroup,_metaf::LightningGroup,_metaf::VicinityGroup,_metaf::MiscGroup,_metaf::UnknownGroup>
                      + 0xc);
        oVar2 = metaf::Pressure::toUnit(&local_10,HECTOPASCAL);
        if (((ulong)oVar2.super__Optional_base<float,_true,_true>._M_payload.
                    super__Optional_payload_base<float> >> 0x20 & 1) != 0) {
          return (float)oVar2.super__Optional_base<float,_true,_true>._M_payload.
                        super__Optional_payload_base<float>._M_payload;
        }
        return NAN;
      }
    }
  }
  return NAN;
}

Assistant:

float WeatherQNHfromMETAR (const std::string& metar)
{
    // --- Parse ---
    const ParseResult& r = ParseMETAR(metar);
    if (r.reportMetadata.error == ReportError::NONE) {
        // Find the pressure group
        for (const GroupInfo& gi: r.groups)
            if (const PressureGroup *pPg = std::get_if<PressureGroup>(&gi.group))
                return pPg->atmosphericPressure().toUnit(Pressure::Unit::HECTOPASCAL).value_or(NAN);
    }
    return NAN;
}